

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void duckdb::DictionaryVector::VerifyDictionary(Vector *vector)

{
  InternalException *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (*vector == (Vector)0x3) {
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "Operation requires a dictionary vector but a non-dictionary vector was encountered",""
            );
  duckdb::InternalException::InternalException(this,(string *)local_40);
  __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void VerifyDictionary(const Vector &vector) {
#ifdef DUCKDB_DEBUG_NO_SAFETY
		D_ASSERT(vector.GetVectorType() == VectorType::DICTIONARY_VECTOR);
#else
		if (vector.GetVectorType() != VectorType::DICTIONARY_VECTOR) {
			throw InternalException(
			    "Operation requires a dictionary vector but a non-dictionary vector was encountered");
		}
#endif
	}